

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_hash.c
# Opt level: O1

void * ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc,u_char *name,size_t len)

{
  void *pvVar1;
  ngx_uint_t key;
  size_t sVar2;
  size_t len_00;
  
  if (len == 0) {
    key = 0;
    len_00 = 0;
  }
  else {
    key = 0;
    sVar2 = 0;
    do {
      len_00 = sVar2;
      if ((ulong)name[sVar2] == 0x2e) break;
      key = key * 0x1f + (ulong)name[sVar2];
      sVar2 = sVar2 + 1;
      len_00 = len;
    } while (len != sVar2);
  }
  if (len_00 == len) {
    return (void *)0x0;
  }
  pvVar1 = ngx_hash_find(&hwc->hash,key,name,len_00);
  if (pvVar1 != (void *)0x0) {
    if (((ulong)pvVar1 & 2) == 0) {
      return pvVar1;
    }
    hwc = (ngx_hash_wildcard_t *)((ulong)pvVar1 & 0xfffffffffffffffc);
    pvVar1 = ngx_hash_find_wc_tail(hwc,name + len_00 + 1,len - (len_00 + 1));
    if (pvVar1 != (void *)0x0) {
      return pvVar1;
    }
  }
  return hwc->value;
}

Assistant:

void *
ngx_hash_find_wc_tail(ngx_hash_wildcard_t *hwc, u_char *name, size_t len)
{
    void        *value;
    ngx_uint_t   i, key;

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "wct:\"%*s\"", len, name);
#endif

    key = 0;

    for (i = 0; i < len; i++) {
        if (name[i] == '.') {
            break;
        }

        key = ngx_hash(key, name[i]);
    }

    if (i == len) {
        return NULL;
    }

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "key:\"%ui\"", key);
#endif

    value = ngx_hash_find(&hwc->hash, key, name, i);

#if 0
    ngx_log_error(NGX_LOG_ALERT, ngx_cycle->log, 0, "value:\"%p\"", value);
#endif

    if (value) {

        /*
         * the 2 low bits of value have the special meaning:
         *     00 - value is data pointer;
         *     11 - value is pointer to wildcard hash allowing "example.*".
         */

        if ((uintptr_t) value & 2) {

            i++;

            hwc = (ngx_hash_wildcard_t *) ((uintptr_t) value & (uintptr_t) ~3);

            value = ngx_hash_find_wc_tail(hwc, &name[i], len - i);

            if (value) {
                return value;
            }

            return hwc->value;
        }

        return value;
    }

    return hwc->value;
}